

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O1

tab_data * __thiscall
dlib::array<dlib::tabbed_display::tab_data,_dlib::memory_manager_stateless_kernel_1<char>_>::element
          (array<dlib::tabbed_display::tab_data,_dlib::memory_manager_stateless_kernel_1<char>_>
           *this)

{
  return this->pos;
}

Assistant:

T& array<T,mem_manager>::
    element (
    )
    {
        // make sure requires clause is not broken
        DLIB_ASSERT(this->current_element_valid(),
            "\tT& array::element()"
            << "\n\tThe current element must be valid if you are to access it."
            << "\n\tthis: " << this
            );

        return *pos;
    }